

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preferences.cpp
# Opt level: O0

void __thiscall f8n::prefs::Preferences::SetString(Preferences *this,char *key,char *value)

{
  allocator<char> local_41;
  string local_40 [32];
  char *local_20;
  char *value_local;
  char *key_local;
  Preferences *this_local;
  
  local_20 = value;
  value_local = key;
  key_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,key,&local_41);
  (*(this->super_IPreferences)._vptr_IPreferences[0x11])(this,local_40,local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void Preferences::SetString(const char* key, const char* value) {
    this->SetString(std::string(key), value);
}